

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

Mesh * vera::planeMesh(Mesh *__return_storage_ptr__,float _width,float _height,int _columns,
                      int _rows,DrawMode _drawMode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  bool bVar7;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aVar8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar9;
  uint32_t local_8c;
  undefined8 local_70;
  DrawMode local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  vec3 local_50;
  vec3 local_40;
  
  Mesh::Mesh(__return_storage_ptr__);
  local_64 = TRIANGLES;
  if (0xfffffffd < _drawMode - TRIANGLE_FAN) {
    local_64 = _drawMode;
  }
  __return_storage_ptr__->m_drawMode = local_64;
  local_50.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_50.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_50.field_2.z = 0.0;
  local_40.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_40.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_40.field_2.z = 1.0;
  local_70._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_70._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  if (_rows + 1 != 0) {
    iVar4 = _columns + 1;
    local_54 = (float)iVar4 + -1.0;
    local_5c = (float)(_rows + 1) + -1.0;
    local_58 = _width * -0.5;
    local_60 = _height * -0.5;
    iVar3 = 0;
    do {
      if (iVar4 != 0) {
        aVar8.y = 1.0 - (float)iVar3 / local_5c;
        aVar9.y = local_60 - (aVar8.y + -1.0) * _height;
        iVar1 = 0;
        do {
          local_70._4_4_ = aVar8.y;
          local_70._0_4_ = (float)iVar1 / local_54;
          local_50.field_1.y = aVar9.y;
          local_50.field_0.x = ((float)iVar1 / local_54) * _width + local_58;
          Mesh::addVertex(__return_storage_ptr__,&local_50);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_70);
          Mesh::addNormal(__return_storage_ptr__,&local_40);
          iVar1 = iVar1 + 1;
        } while (iVar4 != iVar1);
      }
      bVar7 = iVar3 != _rows;
      iVar3 = iVar3 + 1;
    } while (bVar7);
    if (local_64 == TRIANGLE_STRIP) {
      if (0 < _rows) {
        uVar5 = _columns * 2 + 1;
        iVar3 = -1;
        local_8c = 0;
        uVar2 = 0;
        do {
          if ((uVar2 & 1) == 0) {
            uVar6 = local_8c;
            iVar1 = iVar4;
            if (-1 < _columns) {
              do {
                Mesh::addIndex(__return_storage_ptr__,uVar6);
                Mesh::addIndex(__return_storage_ptr__,iVar4 + uVar6);
                iVar1 = iVar1 + -1;
                uVar6 = uVar6 + 1;
              } while (iVar1 != 0);
            }
          }
          else {
            uVar6 = uVar5;
            iVar1 = _columns;
            if (0 < _columns) {
              do {
                Mesh::addIndex(__return_storage_ptr__,uVar6);
                Mesh::addIndex(__return_storage_ptr__,iVar1 + iVar3);
                uVar6 = uVar6 - 1;
                bVar7 = 1 < iVar1;
                iVar1 = iVar1 + -1;
              } while (bVar7);
            }
          }
          uVar2 = uVar2 + 1;
          uVar5 = uVar5 + iVar4;
          iVar3 = iVar3 + iVar4;
          local_8c = local_8c + iVar4;
        } while (uVar2 != _rows);
      }
      if ((_rows & 1U) == 0) {
        Mesh::addIndex(__return_storage_ptr__,
                       (int)((ulong)((long)(__return_storage_ptr__->m_vertices).
                                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(__return_storage_ptr__->m_vertices).
                                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                       -0x55555555 - iVar4);
      }
    }
    else if (0 < _rows) {
      iVar3 = 0;
      do {
        if (0 < _columns) {
          uVar6 = iVar3 * iVar4;
          uVar5 = (iVar3 + 1) * iVar4;
          iVar1 = _columns;
          do {
            Mesh::addIndex(__return_storage_ptr__,uVar6);
            uVar6 = uVar6 + 1;
            Mesh::addIndex(__return_storage_ptr__,uVar6);
            Mesh::addIndex(__return_storage_ptr__,uVar5);
            Mesh::addIndex(__return_storage_ptr__,uVar6);
            Mesh::addIndex(__return_storage_ptr__,uVar5 + 1);
            Mesh::addIndex(__return_storage_ptr__,uVar5);
            iVar1 = iVar1 + -1;
            uVar5 = uVar5 + 1;
          } while (iVar1 != 0);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != _rows);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh planeMesh(float _width, float _height, int _columns, int _rows, DrawMode _drawMode) {
    Mesh mesh;

    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLES;

    _columns++;
    _rows++;

    mesh.setDrawMode(_drawMode);

    glm::vec3 vert(0.0f, 0.0f, 0.0f);
    glm::vec3 normal(0.0f, 0.0f, 1.0f); // always facing forward //
    glm::vec2 texcoord(0.0f, 0.0f);

    // the origin of the plane is at the center //
    float halfW = _width  * 0.5f;
    float halfH = _height * 0.5f;
    
    // add the vertexes //
    for (int iy = 0; iy != _rows; iy++) {
        for (int ix = 0; ix != _columns; ix++) {

            // normalized tex coords //
            texcoord.x =       ((float)ix/((float)_columns-1));
            texcoord.y = 1.f - ((float)iy/((float)_rows-1));

            vert.x = texcoord.x * _width - halfW;
            vert.y = -(texcoord.y-1) * _height - halfH;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    if (_drawMode == TRIANGLE_STRIP) {
        for (int y = 0; y < _rows-1; y++) {
            // even _rows //
            if ((y&1)==0) {
                for (int x = 0; x < _columns; x++) {
                    mesh.addIndex( (y) * _columns + x );
                    mesh.addIndex( (y+1) * _columns + x);
                }
            }
            else {
                for (int x = _columns-1; x >0; x--) {
                    mesh.addIndex( (y+1) * _columns + x );
                    mesh.addIndex( y * _columns + x-1 );
                }
            }
        }

        if (_rows%2 != 0) mesh.addIndex(mesh.getVerticesTotal() - _columns);
    }
    else {

        // Triangles //
        for (int y = 0; y < _rows - 1; y++) {
            for (int x = 0; x < _columns - 1; x++) {
                // first triangle //
                mesh.addIndex((y) *_columns + x);
                mesh.addIndex((y) *_columns + x + 1);
                mesh.addIndex((y + 1) *_columns + x);

                // second triangle //
                mesh.addIndex((y) * _columns + x+1);
                mesh.addIndex((y + 1) *_columns + x+1);
                mesh.addIndex((y + 1) *_columns + x);
            }
        }
    }

    return mesh;
}